

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void add_role(CHAR_DATA *ch,char *string)

{
  undefined1 auVar1 [16];
  char *str;
  size_t sVar2;
  char *pcVar3;
  char buf [16384];
  char obuf [16384];
  char local_8028 [16384];
  char local_4028 [16392];
  
  str = ctime(&current_time);
  chomp(str);
  pcVar3 = ch->pcdata->role;
  if (pcVar3 == (char *)0x0) {
    local_8028[0] = '\0';
  }
  else {
    strcpy(local_8028,pcVar3);
  }
  auVar1 = SEXT816((ch->played + current_time) - ch->logon) * SEXT816(0x48d159e26af37c05);
  sprintf(local_4028,"Role entry added on %s at level %d (%d hours):\n\r",str,
          (ulong)(uint)(int)ch->level,
          (ulong)(uint)((int)(auVar1._8_8_ >> 10) - (auVar1._12_4_ >> 0x1f)));
  strcat(local_8028,local_4028);
  strcat(local_8028,string);
  sVar2 = strlen(local_8028);
  (local_8028 + sVar2)[0] = '\n';
  (local_8028 + sVar2)[1] = '\r';
  local_8028[sVar2 + 2] = '\0';
  free_pstring(ch->pcdata->role);
  pcVar3 = palloc_string(local_8028);
  ch->pcdata->role = pcVar3;
  return;
}

Assistant:

void add_role(CHAR_DATA *ch, char *string)
{
	char buf[MAX_BUF], obuf[MAX_BUF];

	auto strtime = ctime(&current_time);
	chomp(strtime);

	if (ch->pcdata->role)
		sprintf(buf, "%s", ch->pcdata->role);
	else
		strcpy(buf, "");

	sprintf(obuf, "Role entry added on %s at level %d (%d hours):\n\r",
		strtime,
		ch->level,
		(int)((ch->played + current_time - ch->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(ch->pcdata->role);
	ch->pcdata->role = palloc_string(buf);
}